

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int64_t pick_wedge(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,int16_t *residual1,
                  int16_t *diff10,int8_t *best_wedge_sign,int8_t *best_wedge_index,
                  uint64_t *best_sse)

{
  byte bVar1;
  int8_t wedge_sign_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  long lVar8;
  uint8_t *puVar9;
  long lVar10;
  uint8_t *in_RCX;
  BLOCK_SIZE in_DL;
  long in_RSI;
  int16_t *in_R8;
  int16_t *in_R9;
  int8_t *in_stack_00000008;
  int16_t *ds;
  int64_t sign_limit;
  int16_t residual0 [16384];
  int bd_round;
  int hbd;
  uint64_t sse;
  uint8_t *mask;
  int8_t wedge_types;
  int8_t wedge_sign;
  int8_t wedge_index;
  int64_t best_rd;
  int64_t rd;
  int64_t dist;
  int rate;
  int N;
  int bh;
  int bw;
  buf_2d *src;
  MACROBLOCKD *xd;
  uint32_t n;
  int16_t *in_stack_ffffffffffff7f10;
  ptrdiff_t in_stack_ffffffffffff7f18;
  uint8_t *in_stack_ffffffffffff7f20;
  undefined4 in_stack_ffffffffffff7f28;
  int16_t *in_stack_ffffffffffff7f30;
  int16_t *piVar11;
  undefined8 in_stack_ffffffffffff7f38;
  int16_t local_80c0 [4];
  uint8_t *in_stack_ffffffffffff7f48;
  ptrdiff_t in_stack_ffffffffffff7f50;
  int in_stack_ffffffffffff7f6c;
  int64_t in_stack_ffffffffffff7f70;
  int in_stack_ffffffffffff7f78;
  BLOCK_SIZE in_stack_ffffffffffff7f7f;
  MACROBLOCK *in_stack_ffffffffffff7f80;
  AV1_COMP *in_stack_ffffffffffff7f88;
  int *in_stack_ffffffffffff7f98;
  int64_t *in_stack_ffffffffffff7fa0;
  int8_t local_99;
  long local_98;
  long local_88;
  int local_80;
  
  uVar2 = (uint)block_size_wide[in_DL];
  bVar1 = block_size_high[in_DL];
  iVar3 = uVar2 * bVar1;
  local_98 = 0x7fffffffffffffff;
  iVar4 = get_wedge_types_lookup(in_DL);
  iVar5 = is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x1a0));
  if (iVar5 == 0) {
    iVar5 = 0;
    lVar8 = (long)(int)uVar2;
    (*aom_subtract_block)
              ((uint)bVar1,uVar2,local_80c0,(long)(int)uVar2,*(uint8_t **)(in_RSI + 0x30),
               (long)*(int *)(in_RSI + 0x48),in_RCX,lVar8);
    n = (uint32_t)((ulong)lVar8 >> 0x20);
  }
  else {
    iVar5 = (*(int *)(in_RSI + 0x2b40) + -8) * 2;
    n = 0;
    aom_highbd_subtract_block_sse2
              ((int)((ulong)in_stack_ffffffffffff7f38 >> 0x20),(int)in_stack_ffffffffffff7f38,
               in_stack_ffffffffffff7f30,CONCAT44(iVar5,in_stack_ffffffffffff7f28),
               in_stack_ffffffffffff7f20,in_stack_ffffffffffff7f18,in_stack_ffffffffffff7f48,
               in_stack_ffffffffffff7f50);
  }
  uVar6 = aom_sum_squares_i16_sse2(in_stack_ffffffffffff7f10,n);
  uVar7 = aom_sum_squares_i16_sse2(in_stack_ffffffffffff7f10,n);
  lVar8 = (long)((uVar6 - uVar7) * 0x40) / 2;
  piVar11 = local_80c0;
  (*av1_wedge_compute_delta_squares)(piVar11,local_80c0,in_R8,iVar3);
  for (local_99 = '\0'; local_99 < (char)iVar4; local_99 = local_99 + '\x01') {
    puVar9 = av1_get_contiguous_soft_mask(local_99,'\0',in_DL);
    wedge_sign_00 = (*av1_wedge_sign_from_residuals)(piVar11,puVar9,iVar3,lVar8);
    puVar9 = av1_get_contiguous_soft_mask(local_99,wedge_sign_00,in_DL);
    uVar6 = (*av1_wedge_sse_from_residuals)(in_R8,in_R9,puVar9,iVar3);
    model_rd_with_curvfit
              (in_stack_ffffffffffff7f88,in_stack_ffffffffffff7f80,in_stack_ffffffffffff7f7f,
               in_stack_ffffffffffff7f78,in_stack_ffffffffffff7f70,in_stack_ffffffffffff7f6c,
               in_stack_ffffffffffff7f98,in_stack_ffffffffffff7fa0);
    local_80 = *(int *)(in_RSI + 0x8318 + (ulong)in_DL * 0x40 + (long)local_99 * 4) + local_80;
    lVar10 = ((long)local_80 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) + local_88 * 0x80;
    if (lVar10 < local_98) {
      *best_wedge_sign = local_99;
      *in_stack_00000008 = wedge_sign_00;
      *(uint64_t *)best_wedge_index =
           uVar6 + (long)((1 << ((byte)iVar5 & 0x1f)) >> 1) >> ((byte)iVar5 & 0x3f);
      local_98 = lVar10;
    }
  }
  return local_98 -
         ((long)*(int *)(in_RSI + 0x8318 + (ulong)in_DL * 0x40 + (long)*best_wedge_sign * 4) *
          (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9);
}

Assistant:

static int64_t pick_wedge(const AV1_COMP *const cpi, const MACROBLOCK *const x,
                          const BLOCK_SIZE bsize, const uint8_t *const p0,
                          const int16_t *const residual1,
                          const int16_t *const diff10,
                          int8_t *const best_wedge_sign,
                          int8_t *const best_wedge_index, uint64_t *best_sse) {
  const MACROBLOCKD *const xd = &x->e_mbd;
  const struct buf_2d *const src = &x->plane[0].src;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int N = bw * bh;
  assert(N >= 64);
  int rate;
  int64_t dist;
  int64_t rd, best_rd = INT64_MAX;
  int8_t wedge_index;
  int8_t wedge_sign;
  const int8_t wedge_types = get_wedge_types_lookup(bsize);
  const uint8_t *mask;
  uint64_t sse;
  const int hbd = is_cur_buf_hbd(xd);
  const int bd_round = hbd ? (xd->bd - 8) * 2 : 0;

  DECLARE_ALIGNED(32, int16_t, residual0[MAX_SB_SQUARE]);  // src - pred0
#if CONFIG_AV1_HIGHBITDEPTH
  if (hbd) {
    aom_highbd_subtract_block(bh, bw, residual0, bw, src->buf, src->stride,
                              CONVERT_TO_BYTEPTR(p0), bw);
  } else {
    aom_subtract_block(bh, bw, residual0, bw, src->buf, src->stride, p0, bw);
  }
#else
  (void)hbd;
  aom_subtract_block(bh, bw, residual0, bw, src->buf, src->stride, p0, bw);
#endif

  int64_t sign_limit = ((int64_t)aom_sum_squares_i16(residual0, N) -
                        (int64_t)aom_sum_squares_i16(residual1, N)) *
                       (1 << WEDGE_WEIGHT_BITS) / 2;
  int16_t *ds = residual0;

  av1_wedge_compute_delta_squares(ds, residual0, residual1, N);

  for (wedge_index = 0; wedge_index < wedge_types; ++wedge_index) {
    mask = av1_get_contiguous_soft_mask(wedge_index, 0, bsize);

    wedge_sign = av1_wedge_sign_from_residuals(ds, mask, N, sign_limit);

    mask = av1_get_contiguous_soft_mask(wedge_index, wedge_sign, bsize);
    sse = av1_wedge_sse_from_residuals(residual1, diff10, mask, N);
    sse = ROUND_POWER_OF_TWO(sse, bd_round);

    model_rd_sse_fn[MODELRD_TYPE_MASKED_COMPOUND](cpi, x, bsize, 0, sse, N,
                                                  &rate, &dist);

    rate += x->mode_costs.wedge_idx_cost[bsize][wedge_index];
    rd = RDCOST(x->rdmult, rate, dist);

    if (rd < best_rd) {
      *best_wedge_index = wedge_index;
      *best_wedge_sign = wedge_sign;
      best_rd = rd;
      *best_sse = sse;
    }
  }

  return best_rd -
         RDCOST(x->rdmult,
                x->mode_costs.wedge_idx_cost[bsize][*best_wedge_index], 0);
}